

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corealloc.h
# Opt level: O3

bool __thiscall
snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::flush
          (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *this,
          bool destroy_queue)

{
  undefined1 *puVar1;
  conditional_t<Config::Options_AllocOwnsLocalState,_LocalState,_LocalState_*> *domesticate;
  Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>
  *this_00;
  unsigned_short *puVar2;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *pTVar3;
  void **ppvVar4;
  ulong uVar5;
  code *pcVar6;
  anon_class_24_1_3fcf651d cb;
  Node *pNVar7;
  Node **ppNVar8;
  bool bVar9;
  Node *pNVar10;
  bool bVar11;
  address_t n;
  BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  p;
  long lVar12;
  BackendSlabMetadata *meta;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  undefined7 in_register_00000031;
  Node *pNVar16;
  address_t n_2;
  PagemapEntry *entry;
  Node *pNVar17;
  bool bVar18;
  smallsizeclass_t sizeclass;
  smallsizeclass_t sizeclass_00;
  size_t bytes_flushed;
  size_t local_50;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_48;
  conditional_t<Config::Options_AllocOwnsLocalState,_LocalState,_LocalState_*> *pcStack_40;
  size_t *local_38;
  
  domesticate = &this->backend_state;
  local_50 = 0;
  if ((int)CONCAT71(in_register_00000031,destroy_queue) == 0) {
    while ((this->remote_alloc).list.front.unsafe_capptr._M_b._M_p !=
           (this->remote_alloc).list.back.unsafe_capptr._M_b._M_p) {
      if ((this->remote_alloc).list.front.unsafe_capptr._M_b._M_p !=
          (this->remote_alloc).list.back.unsafe_capptr._M_b._M_p) {
        Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::
        handle_message_queue_slow<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::flush(bool)::_lambda()_1_>
                  ((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>
                    *)this);
      }
    }
  }
  else {
    local_38 = &local_50;
    cb.cb.domesticate.local_state = domesticate;
    cb.cb.this = this;
    cb.cb.bytes_flushed = local_38;
    local_48 = this;
    pcStack_40 = domesticate;
    FreeListMPSCQ<snmalloc::RemoteAllocator::key_global,0ul>::
    destroy_and_iterate<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::flush(bool)::_lambda(snmalloc::CapPtr<snmalloc::freelist::Object::T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>)_1_,snmalloc::RemoteAllocator::destroy_and_iterate<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::flush(bool)::_lambda(snmalloc::CapPtr<snmalloc::freelist::Object::T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::cap___,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>>)_1_>
              ((FreeListMPSCQ<snmalloc::RemoteAllocator::key_global,0ul> *)&this->remote_alloc,
               (anon_class_8_1_7a75751d)domesticate,cb);
  }
  lVar12 = 0;
  do {
    pTVar3 = (this->super_FastFreeLists).small_fast_free_lists[lVar12].curr.unsafe_capptr;
    if (pTVar3 != (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                   *)0x0) {
      this_00 = (Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>
                 *)((this->super_FastFreeLists).small_fast_free_lists + lVar12);
      entry = (PagemapEntry *)
              ((long)&((BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                        ::concretePagemap.body)->
                      super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                      ).super_MetaEntryBase.meta + ((ulong)pTVar3 >> 10 & 0xfffffffffffffff0));
      do {
        p = freelist::
            Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>
            ::
            take<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::flush(bool)::_lambda(snmalloc::CapPtr<snmalloc::freelist::Object::T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>)_1_>
                      (this_00,&freelist::Object::key_root,(anon_class_8_1_7a75751d)domesticate);
        uVar13 = (ulong)(((uint)(entry->
                                super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                                ).super_MetaEntryBase.remote_and_sizeclass & 0x7f) << 5);
        if (*(ulong *)(sizeclass_metadata + uVar13 + 0x18) <=
            (*(ulong *)(sizeclass_metadata + uVar13 + 8) & (ulong)p.unsafe_capptr) *
            *(ulong *)(sizeclass_metadata + uVar13 + 0x18)) goto LAB_001082e5;
        uVar13 = (entry->
                 super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                 ).super_MetaEntryBase.meta;
        meta = (BackendSlabMetadata *)(uVar13 & 0xfffffffffffffffe);
        uVar13 = uVar13 >> 3;
        uVar14 = (this->entropy).bit_source;
        uVar5 = uVar14 >> 1;
        (this->entropy).bit_source = uVar5 | (ulong)((uVar14 & 1) != 0) << 0x3f;
        uVar15 = (uint)uVar5 & 1;
        ppvVar4 = (meta->
                  super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
                  ).free_queue.end._M_elems[uVar15];
        ((p.unsafe_capptr)->prev).prev_encoded =
             ((long)&(p.unsafe_capptr)->field_0 + (freelist::Object::key_root.key2 ^ uVar13)) *
             (freelist::Object::key_root.key1 + (long)ppvVar4);
        *ppvVar4 = (void *)(freelist::Object::key_root.key_next ^ (ulong)p.unsafe_capptr ^ uVar13);
        (meta->
        super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
        ).free_queue.end._M_elems[uVar15] = (void **)p.unsafe_capptr;
        puVar2 = (meta->
                 super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
                 ).free_queue.length._M_elems + uVar15;
        *puVar2 = *puVar2 + 1;
        puVar1 = &(meta->
                  super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
                  ).free_queue.field_0x24;
        *(short *)puVar1 = *(short *)puVar1 + -1;
        if (*(short *)puVar1 == 0) {
          dealloc_local_object_slow(this,(Alloc<void>)p.unsafe_capptr,entry,meta);
        }
      } while (*(long *)(this_00 + 8) != 0);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x2b);
  bVar11 = RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>
           ::post<11008ul>((RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>
                            *)&this->remote_dealloc_cache,domesticate,
                           (alloc_id_t)&this->remote_alloc);
  sizeclass_00 = 0;
  do {
    dealloc_local_slabs<true>(this,sizeclass_00);
    sizeclass_00 = sizeclass_00 + 1;
  } while (sizeclass_00 != 0x2b);
  pNVar10 = (this->laden).head.next;
  do {
    do {
      pNVar7 = pNVar10;
      if (pNVar7 == &(this->laden).head) {
        (this->remote_dealloc_cache).capacity = 0;
        return bVar11;
      }
      pNVar10 = pNVar7->next;
    } while (*(char *)((long)&pNVar7[3].next + 7) != '\0');
    uVar13 = (ulong)pNVar7 >> 3;
    lVar12 = 0;
    bVar9 = true;
    do {
      bVar18 = bVar9;
      pNVar17 = (Node *)(&pNVar7[1].next + lVar12);
      if (pNVar17 == (&pNVar7[2].next)[lVar12]) {
        if (*(short *)((long)&pNVar7[3].next + lVar12 * 2) != 0) {
          report_fatal_error<1024ul,char_const*,char_const*,char_const*,char_const*>
                    ("Check fail: {} in {} on {} \n","!TRACK_LENGTH || (length[i] == 0)",
                     "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O3/_deps/snmalloc-src/src/snmalloc/backend_helpers/../mem/freelist.h"
                     ,"966");
        }
      }
      else {
        pNVar16 = (Node *)((ulong)pNVar17->next ^ uVar13 ^ freelist::Object::key_root.key_next);
        if (pNVar16->prev !=
            (Node *)((long)((long)&pNVar16->next + (freelist::Object::key_root.key2 ^ uVar13)) *
                    (long)((long)&pNVar17->next + freelist::Object::key_root.key1))) {
LAB_001082e5:
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
        uVar14 = 1;
        while (pNVar16 != (&pNVar7[2].next)[lVar12]) {
          uVar14 = uVar14 + 1;
          pNVar17 = (Node *)((ulong)pNVar16->next ^ uVar13 ^ freelist::Object::key_root.key_next);
          ppNVar8 = &pNVar16->next;
          pNVar16 = pNVar17;
          if (pNVar17->prev !=
              (Node *)((long)((long)&pNVar17->next + (freelist::Object::key_root.key2 ^ uVar13)) *
                      (long)((long)ppNVar8 + freelist::Object::key_root.key1))) goto LAB_001082e5;
        }
        if (*(ushort *)((long)&pNVar7[3].next + lVar12 * 2) != uVar14) {
          report_fatal_error<1024ul,char_const*,char_const*,char_const*,char_const*>
                    ("Check fail: {} in {} on {} \n","!TRACK_LENGTH || (count == length[i])",
                     "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O3/_deps/snmalloc-src/src/snmalloc/backend_helpers/../mem/freelist.h"
                     ,"984");
        }
      }
      lVar12 = 1;
      bVar9 = false;
    } while (bVar18);
  } while( true );
}

Assistant:

bool flush(bool destroy_queue = false)
    {
      auto local_state = backend_state_ptr();
      auto domesticate = [local_state](freelist::QueuePtr p)
                           SNMALLOC_FAST_PATH_LAMBDA {
                             return capptr_domesticate<Config>(local_state, p);
                           };

      size_t bytes_flushed = 0; // Not currently used.

      if (destroy_queue)
      {
        auto cb =
          [this, domesticate, &bytes_flushed](capptr::Alloc<RemoteMessage> m) {
            bool need_post = true; // Always going to post, so ignore.
            const PagemapEntry& entry =
              Config::Backend::get_metaentry(snmalloc::address_cast(m));
            handle_dealloc_remote(
              entry, m, need_post, domesticate, bytes_flushed);
          };

        message_queue().destroy_and_iterate(domesticate, cb);
      }
      else
      {
        // Process incoming message queue
        // Loop as normally only processes a batch
        while (has_messages())
          handle_message_queue([]() {});
      }

      auto& key = freelist::Object::key_root;

      for (size_t i = 0; i < NUM_SMALL_SIZECLASSES; i++)
      {
        if (small_fast_free_lists[i].empty())
          continue;

        // All elements should have the same entry.
        const auto& entry = Config::Backend::get_metaentry(
          address_cast(small_fast_free_lists[i].peek()));
        do
        {
          auto p = small_fast_free_lists[i].take(key, domesticate);
          SNMALLOC_ASSERT(is_start_of_object(
            sizeclass_t::from_small_class(i), address_cast(p)));
          dealloc_local_object(p.as_void(), entry);
        } while (!small_fast_free_lists[i].empty());
      }

      auto posted = remote_dealloc_cache.template post<sizeof(Allocator)>(
        local_state, get_trunc_id());

      // We may now have unused slabs, return to the global allocator.
      for (smallsizeclass_t sizeclass = 0; sizeclass < NUM_SMALL_SIZECLASSES;
           sizeclass++)
      {
        dealloc_local_slabs<true>(sizeclass);
      }

      laden.iterate(
        [domesticate](BackendSlabMetadata* meta) SNMALLOC_FAST_PATH_LAMBDA {
          if (!meta->is_large())
          {
            meta->free_queue.validate(
              freelist::Object::key_root, meta->as_key_tweak(), domesticate);
          }
        });

      // Set the remote_dealloc_cache to immediately slow path.
      remote_dealloc_cache.capacity = 0;

      return posted;
    }